

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PInt::PInt(PInt *this)

{
  PSymbolConstNumeric *pPVar1;
  size_t len;
  FName local_24;
  FName local_20 [4];
  PInt *local_10;
  PInt *this_local;
  
  len = 4;
  local_10 = this;
  PBasicType::PBasicType((PBasicType *)this,4,4);
  *(undefined ***)this = &PTR_StaticType_00b6a350;
  this->Unsigned = false;
  pPVar1 = (PSymbolConstNumeric *)DObject::operator_new((DObject *)0x38,len);
  FName::FName(local_20,NAME_Min);
  PSymbolConstNumeric::PSymbolConstNumeric(pPVar1,local_20,(PType *)this,-0x80000000);
  PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pPVar1);
  pPVar1 = (PSymbolConstNumeric *)DObject::operator_new((DObject *)0x38,(size_t)pPVar1);
  FName::FName(&local_24,NAME_Max);
  PSymbolConstNumeric::PSymbolConstNumeric(pPVar1,&local_24,(PType *)this,0x7fffffff);
  PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pPVar1);
  return;
}

Assistant:

PInt::PInt()
: PBasicType(4, 4), Unsigned(false)
{
	Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Min, this, -0x7FFFFFFF - 1));
	Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Max, this,  0x7FFFFFFF));
}